

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlPatternCompileSafe
              (xmlChar *pattern,xmlDict *dict,int flags,xmlChar **namespaces,
              xmlPatternPtr *patternOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  xmlPatOp xVar3;
  xmlStepOpPtr pxVar4;
  xmlDictPtr dict_00;
  xmlStreamStepPtr pxVar5;
  undefined8 uVar6;
  xmlChar *pxVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  xmlPatParserContextPtr ctxt;
  xmlPatternPtr comp;
  byte *pbVar14;
  xmlStreamCompPtr pxVar15;
  xmlChar xVar16;
  uint uVar17;
  byte *pbVar18;
  xmlChar *pxVar19;
  _xmlPattern *p_Var20;
  long lVar21;
  xmlChar *pxVar22;
  long lVar23;
  xmlPatternPtr pxVar24;
  xmlChar **ppxVar25;
  uint flags_00;
  xmlChar **ppxVar26;
  long lVar27;
  ulong uVar28;
  uint local_84;
  xmlChar *local_80;
  xmlPatternPtr local_70;
  xmlChar *local_50;
  
  if (patternOut == (xmlPatternPtr *)0x0) {
    iVar13 = 1;
  }
  else {
    if (pattern == (xmlChar *)0x0) {
      iVar13 = 1;
LAB_0016b206:
      local_70 = (xmlPatternPtr)0x0;
    }
    else {
      uVar10 = 0;
      uVar17 = flags | 0x200;
      local_70 = (xmlPatternPtr)0x0;
      local_84 = 1;
      local_50 = pattern;
LAB_0016a7fe:
      xVar16 = *local_50;
      if (xVar16 != '\0') {
        lVar21 = 0;
        while (xVar16 != '\0') {
          if (xVar16 == '|') {
            local_80 = xmlStrndup(local_50,(int)lVar21);
            if (local_80 == (xmlChar *)0x0) {
              ctxt = (xmlPatParserContextPtr)0x0;
            }
            else {
              ctxt = xmlNewPatParserContext(local_80,dict,namespaces);
            }
            lVar21 = lVar21 + 1;
            goto LAB_0016a87f;
          }
          lVar23 = lVar21 + 1;
          lVar21 = lVar21 + 1;
          xVar16 = local_50[lVar23];
        }
        ctxt = xmlNewPatParserContext(local_50,dict,namespaces);
        local_80 = (xmlChar *)0x0;
LAB_0016a87f:
        local_50 = local_50 + lVar21;
        if (ctxt != (xmlPatParserContextPtr)0x0) {
          comp = (xmlPatternPtr)(*xmlMalloc)(0x40);
          if (comp != (xmlPatternPtr)0x0) {
            comp->steps = (xmlStepOpPtr)0x0;
            comp->stream = (xmlStreamCompPtr)0x0;
            comp->flags = 0;
            comp->nbStep = 0;
            comp->maxStep = 0;
            *(undefined4 *)&comp->field_0x2c = 0;
            comp->next = (_xmlPattern *)0x0;
            comp->pattern = (xmlChar *)0x0;
            comp->data = (void *)0x0;
            comp->dict = (xmlDictPtr)0x0;
            if (dict != (xmlDict *)0x0) {
              comp->dict = dict;
              xmlDictReference(dict);
            }
            pxVar24 = comp;
            if (local_70 != (xmlPatternPtr)0x0) {
              comp->next = local_70->next;
              local_70->next = comp;
              pxVar24 = local_70;
            }
            local_70 = pxVar24;
            comp->flags = flags;
            ctxt->comp = comp;
            pbVar14 = ctxt->cur;
            pbVar18 = pbVar14;
            if ((flags & 6U) != 0) {
              while( true ) {
                pbVar18 = pbVar18 + 1;
                uVar28 = (ulong)*pbVar14;
                if (0x2f < uVar28) break;
                if ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0) {
                  if (uVar28 == 0x2f) goto LAB_0016a96d;
                  break;
                }
                pbVar14 = pbVar14 + 1;
                ctxt->cur = pbVar14;
              }
              comp->flags = uVar17;
              if (*pbVar14 != 0x2e) goto LAB_0016afbd;
              while( true ) {
                ctxt->cur = pbVar18;
                uVar28 = (ulong)*pbVar18;
                if (0x2f < uVar28) break;
                if ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0) {
                  if (uVar28 == 0) {
                    iVar13 = xmlPatternAdd(ctxt,comp,XML_OP_ELEM,(xmlChar *)0x0,(xmlChar *)0x0);
                    if (iVar13 == 0) goto LAB_0016a974;
                  }
                  else if (uVar28 == 0x2f) goto LAB_0016ad49;
                  break;
                }
                pbVar18 = pbVar18 + 1;
              }
              goto LAB_0016a96d;
            }
            while( true ) {
              pbVar18 = pbVar14 + 1;
              bVar9 = *pbVar14;
              uVar28 = (ulong)bVar9;
              if (0x2f < uVar28) break;
              if ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0) {
                uVar12 = uVar17;
                if ((uVar28 == 0x2e) || (uVar12 = flags | 0x100, uVar28 == 0x2f)) goto LAB_0016adb0;
                break;
              }
              ctxt->cur = pbVar18;
              pbVar14 = pbVar18;
            }
            uVar12 = uVar17;
            if ((flags & 1U) != 0) {
LAB_0016adb0:
              comp->flags = uVar12;
              bVar9 = *pbVar14;
            }
            if (bVar9 == 0x2e) {
              if ((*pbVar18 == 0x2f) && (pbVar14[2] == 0x2f)) {
                iVar13 = xmlPatternAdd(ctxt,comp,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0);
                if (iVar13 == 0) {
                  pbVar18 = ctxt->cur;
                  pbVar14 = pbVar18;
                  if (*pbVar18 == 0) goto LAB_0016b054;
                  ctxt->cur = pbVar18 + 1;
                  pbVar14 = pbVar18 + 1;
                  if (pbVar18[1] == 0) goto LAB_0016b054;
                  ctxt->cur = pbVar18 + 2;
                  pbVar14 = pbVar18 + 2;
                  if (pbVar18[2] == 0) goto LAB_0016b054;
                  pbVar14 = pbVar18 + 3;
                  while( true ) {
                    ctxt->cur = pbVar14;
LAB_0016b054:
                    bVar9 = *pbVar14;
                    uVar28 = (ulong)bVar9;
                    if (0x20 < uVar28) goto LAB_0016ae82;
                    if ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0) break;
                    pbVar14 = pbVar14 + 1;
                  }
                  if (uVar28 != 0) goto LAB_0016ae82;
                  goto LAB_0016a96d;
                }
                goto LAB_0016a974;
              }
LAB_0016b09d:
              xmlCompileStepPattern(ctxt);
              if (ctxt->error == 0) {
                pbVar14 = ctxt->cur;
                while ((uVar28 = (ulong)*pbVar14, uVar28 < 0x21 &&
                       ((0x100002600U >> (uVar28 & 0x3f) & 1) != 0))) {
                  pbVar14 = pbVar14 + 1;
                  ctxt->cur = pbVar14;
                }
                while (xVar16 = (xmlChar)uVar28, xVar16 == '/') {
                  if (pbVar14[1] == 0x2f) {
                    iVar13 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ANCESTOR,(xmlChar *)0x0,
                                           (xmlChar *)0x0);
                    if (iVar13 != 0) goto LAB_0016a974;
                    pbVar14 = ctxt->cur;
                    pbVar18 = pbVar14;
                    if (*pbVar14 == 0) goto LAB_0016b160;
                    ctxt->cur = pbVar14 + 1;
                    pbVar18 = pbVar14 + 1;
                    if (pbVar14[1] == 0) goto LAB_0016b160;
                    pbVar18 = pbVar14 + 2;
                    while( true ) {
                      ctxt->cur = pbVar18;
LAB_0016b160:
                      if ((0x20 < (ulong)*pbVar18) ||
                         ((0x100002600U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0)) break;
                      pbVar18 = pbVar18 + 1;
                    }
                  }
                  else {
                    iVar13 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_PARENT,(xmlChar *)0x0,
                                           (xmlChar *)0x0);
                    if (iVar13 != 0) goto LAB_0016a974;
                    pbVar14 = ctxt->cur;
                    if (*pbVar14 != 0) goto LAB_0016b14e;
                    while (uVar28 = (ulong)*pbVar14, uVar28 < 0x21) {
                      if ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0) {
                        if (uVar28 == 0) goto LAB_0016a96d;
                        break;
                      }
LAB_0016b14e:
                      pbVar14 = pbVar14 + 1;
                      ctxt->cur = pbVar14;
                    }
                  }
                  xmlCompileStepPattern(ctxt);
                  if (ctxt->error != 0) goto LAB_0016a974;
                  pbVar14 = ctxt->cur;
                  uVar28 = (ulong)*pbVar14;
                }
LAB_0016af85:
                if (xVar16 != '\0') goto LAB_0016a96d;
              }
            }
            else {
              if (bVar9 != 0x2f) {
LAB_0016ae82:
                if (bVar9 != 0x40) {
                  if (bVar9 != 0x2f) goto LAB_0016b09d;
                  pxVar24 = ctxt->comp;
                  goto LAB_0016ae97;
                }
                ctxt->cur = pbVar14 + 1;
                xmlCompileAttributeTest(ctxt);
                if (ctxt->error != 0) goto LAB_0016a974;
                pbVar14 = ctxt->cur;
                while( true ) {
                  uVar28 = (ulong)*pbVar14;
                  if (0x20 < uVar28) break;
                  if ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0) {
                    if (uVar28 == 0) goto LAB_0016a974;
                    break;
                  }
                  ctxt->cur = pbVar14 + 1;
                  pbVar14 = pbVar14 + 1;
                }
                xmlCompileStepPattern(ctxt);
                if (ctxt->error != 0) goto LAB_0016a974;
                xVar16 = *ctxt->cur;
                goto LAB_0016af85;
              }
              pxVar24 = comp;
              if (*pbVar18 == 0x2f) {
                iVar13 = xmlPatternAdd(ctxt,comp,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0);
                if (iVar13 != 0) goto LAB_0016a974;
                pxVar22 = ctxt->cur;
                if ((*pxVar22 == '\0') || (ctxt->cur = pxVar22 + 1, pxVar22[1] == '\0'))
                goto LAB_0016b09d;
                pbVar14 = pxVar22 + 2;
                ctxt->cur = pbVar14;
                bVar9 = pxVar22[2];
                goto LAB_0016ae82;
              }
LAB_0016ae97:
              iVar13 = xmlPatternAdd(ctxt,pxVar24,XML_OP_ROOT,(xmlChar *)0x0,(xmlChar *)0x0);
              if (iVar13 == 0) {
                pbVar14 = ctxt->cur;
                if (*pbVar14 != 0) goto LAB_0016b08c;
                while (uVar28 = (ulong)*pbVar14, uVar28 < 0x21) {
                  if ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0) {
                    if (uVar28 == 0) goto LAB_0016a96d;
                    break;
                  }
LAB_0016b08c:
                  pbVar14 = pbVar14 + 1;
                  ctxt->cur = pbVar14;
                }
                goto LAB_0016b09d;
              }
            }
            goto LAB_0016a974;
          }
          iVar13 = -1;
          goto LAB_0016b1c3;
        }
        goto LAB_0016b19d;
      }
      iVar13 = 0;
      p_Var20 = local_70;
      if (local_84 == 0) {
        for (; p_Var20 != (xmlPatternPtr)0x0; p_Var20 = p_Var20->next) {
          if (p_Var20->stream != (xmlStreamCompPtr)0x0) {
            xmlFreeStreamComp(p_Var20->stream);
            p_Var20->stream = (xmlStreamCompPtr)0x0;
          }
        }
      }
    }
    *patternOut = local_70;
  }
  return iVar13;
  while ((0x100002600U >> (uVar28 & 0x3f) & 1) != 0) {
LAB_0016ad49:
    pbVar14 = pbVar18;
    pbVar18 = pbVar14 + 1;
    ctxt->cur = pbVar18;
    bVar9 = *pbVar18;
    uVar28 = (ulong)bVar9;
    if (0x2f < uVar28) goto LAB_0016afb1;
  }
  if (uVar28 == 0x2f) {
    uVar28 = (ulong)*pbVar14;
    if (((0x20 < uVar28) || ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0)) &&
       (iVar13 = xmlPatternAdd(ctxt,comp,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0), iVar13 == 0
       )) {
      pbVar14 = ctxt->cur;
      if (*pbVar14 != 0) goto LAB_0016afa9;
      while( true ) {
        bVar9 = *pbVar14;
        if ((0x20 < (ulong)bVar9) || ((0x100002600U >> ((ulong)bVar9 & 0x3f) & 1) == 0)) break;
LAB_0016afa9:
        pbVar14 = pbVar14 + 1;
        ctxt->cur = pbVar14;
      }
      goto LAB_0016afb1;
    }
  }
  else {
LAB_0016afb1:
    if (bVar9 != 0) {
LAB_0016afbd:
      do {
        xmlCompileStepPattern(ctxt);
        if (ctxt->error != 0) break;
        pbVar14 = ctxt->cur;
        while( true ) {
          uVar28 = (ulong)*pbVar14;
          if (0x2f < uVar28) goto LAB_0016a96d;
          if ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0) break;
          ctxt->cur = pbVar14 + 1;
          pbVar14 = pbVar14 + 1;
        }
        if (uVar28 == 0) goto LAB_0016a974;
        if ((uVar28 != 0x2f) ||
           (iVar13 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_PARENT,(xmlChar *)0x0,(xmlChar *)0x0),
           iVar13 != 0)) break;
        pbVar14 = ctxt->cur;
        if (*pbVar14 != 0) goto LAB_0016b034;
        while (uVar28 = (ulong)*pbVar14, uVar28 < 0x30) {
          if ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0) {
            if ((uVar28 == 0) || (uVar28 == 0x2f)) goto LAB_0016a96d;
            break;
          }
LAB_0016b034:
          pbVar14 = pbVar14 + 1;
          ctxt->cur = pbVar14;
        }
      } while( true );
    }
  }
LAB_0016a96d:
  ctxt->error = 1;
LAB_0016a974:
  iVar13 = ctxt->error;
  if (iVar13 != 0) {
LAB_0016b1c3:
    *(undefined4 *)&ctxt->namespaces = 0xffffffff;
    *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
    ctxt->nb_namespaces = -1;
    *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
    *(undefined4 *)&ctxt->comp = 0xffffffff;
    *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->elem = 0xffffffff;
    *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
    ctxt->error = -1;
    *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
    *(undefined4 *)&ctxt->dict = 0xffffffff;
    *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->cur = 0xffffffff;
    *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->base = 0xffffffff;
    *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
    (*xmlFree)(ctxt);
    goto LAB_0016b1e6;
  }
  *(undefined4 *)&ctxt->namespaces = 0xffffffff;
  *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
  ctxt->nb_namespaces = -1;
  *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
  *(undefined4 *)&ctxt->comp = 0xffffffff;
  *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
  *(undefined4 *)&ctxt->elem = 0xffffffff;
  *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
  ctxt->error = -1;
  *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
  *(undefined4 *)&ctxt->dict = 0xffffffff;
  *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
  *(undefined4 *)&ctxt->cur = 0xffffffff;
  *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
  *(undefined4 *)&ctxt->base = 0xffffffff;
  *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
  (*xmlFree)(ctxt);
  if (local_84 == 0) {
    local_84 = 0;
    goto LAB_0016ac5e;
  }
  if (uVar10 == 0x200) {
    local_84 = (uint)comp->flags >> 8 & 1;
    uVar10 = 0x200;
    uVar12 = local_84;
joined_r0x0016aa74:
    local_84 = local_84 ^ 1;
    if (uVar12 != 0) goto LAB_0016ac5e;
  }
  else {
    if (uVar10 == 0x100) {
      uVar12 = comp->flags & 0x200;
      local_84 = uVar12 >> 9;
      uVar10 = 0x100;
      goto joined_r0x0016aa74;
    }
    local_84 = 1;
    if (uVar10 == 0) {
      uVar10 = comp->flags & 0x300;
      local_84 = 1;
    }
  }
  pxVar4 = comp->steps;
  if (pxVar4 != (xmlStepOpPtr)0x0) {
    if ((((comp->nbStep == 1) && (pxVar4->op == XML_OP_ELEM)) && (pxVar4->value == (xmlChar *)0x0))
       && (pxVar4->value2 == (xmlChar *)0x0)) {
      pxVar15 = xmlNewStreamComp(0);
      if (pxVar15 != (xmlStreamCompPtr)0x0) {
        pbVar14 = (byte *)((long)&pxVar15->flags + 1);
        *pbVar14 = *pbVar14 | 0x40;
        comp->stream = pxVar15;
LAB_0016ac5e:
        uVar12 = comp->nbStep;
        if ((0 < (int)uVar12) && (pxVar4 = comp->steps, pxVar4->op == XML_OP_ANCESTOR)) {
          uVar12 = uVar12 - 1;
          for (lVar21 = 0; (ulong)uVar12 * 0x18 - lVar21 != 0; lVar21 = lVar21 + 0x18) {
            puVar1 = (undefined8 *)((long)&pxVar4[1].value + lVar21);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pxVar4->value + lVar21);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            *(undefined4 *)((long)&pxVar4->op + lVar21) =
                 *(undefined4 *)((long)&pxVar4[1].op + lVar21);
          }
          comp->nbStep = uVar12;
        }
        if ((int)uVar12 < comp->maxStep) {
LAB_0016acaf:
          lVar23 = (long)(int)uVar12;
          pxVar4 = comp->steps;
          ppxVar25 = &pxVar4->value;
          ppxVar26 = &pxVar4[lVar23 + -1].value;
          lVar21 = lVar23;
          for (lVar27 = 0; lVar21 = lVar21 + -1, lVar27 < lVar21; lVar27 = lVar27 + 1) {
            pxVar22 = *ppxVar25;
            pxVar19 = ppxVar25[1];
            pxVar7 = ppxVar26[1];
            *ppxVar25 = *ppxVar26;
            ppxVar25[1] = pxVar7;
            *ppxVar26 = pxVar22;
            ppxVar26[1] = pxVar19;
            xVar3 = ((xmlStepOp *)(ppxVar25 + -1))->op;
            ((xmlStepOp *)(ppxVar25 + -1))->op = ((xmlStepOp *)(ppxVar26 + -1))->op;
            ((xmlStepOp *)(ppxVar26 + -1))->op = xVar3;
            ppxVar25 = ppxVar25 + 3;
            ppxVar26 = ppxVar26 + -3;
          }
          pxVar4[lVar23].value = (xmlChar *)0x0;
          pxVar4[lVar23].value2 = (xmlChar *)0x0;
          comp->nbStep = uVar12 + 1;
          pxVar4[lVar23].op = XML_OP_END;
          if (local_80 != (xmlChar *)0x0) {
            (*xmlFree)(local_80);
          }
          goto LAB_0016a7fe;
        }
        iVar13 = xmlPatternGrow(comp);
        if (-1 < iVar13) {
          uVar12 = comp->nbStep;
          goto LAB_0016acaf;
        }
      }
    }
    else {
      pxVar15 = xmlNewStreamComp(comp->nbStep / 2 + 1);
      if (pxVar15 != (xmlStreamCompPtr)0x0) {
        dict_00 = comp->dict;
        if (dict_00 != (xmlDictPtr)0x0) {
          pxVar15->dict = dict_00;
          xmlDictReference(dict_00);
        }
        if ((comp->flags & 0x100) != 0) {
          pbVar14 = (byte *)((long)&pxVar15->flags + 1);
          *pbVar14 = *pbVar14 | 0x80;
        }
        lVar21 = 0;
        bVar8 = false;
        flags_00 = 0;
        uVar12 = 0xffffffff;
        uVar11 = 0;
        for (uVar28 = 1; (long)(uVar28 - 1) < (long)comp->nbStep; uVar28 = uVar28 + 1) {
          pxVar4 = comp->steps;
          iVar13 = *(int *)((long)&pxVar4->op + lVar21);
          if (7 < iVar13 - 1U) goto switchD_0016ab2f_caseD_5;
          pxVar22 = *(xmlChar **)((long)&pxVar4->value + lVar21);
          pxVar19 = *(xmlChar **)((long)&pxVar4->value2 + lVar21);
          switch(iVar13) {
          case 1:
            bVar8 = true;
            if (lVar21 != 0) goto LAB_0016ac4a;
            break;
          case 2:
            if (pxVar22 != (xmlChar *)0x0 || pxVar19 != (xmlChar *)0x0)
            goto switchD_0016ab2f_caseD_3;
            if (flags_00 != 0 && uVar28 == (uint)comp->nbStep) {
              pbVar14 = (byte *)((long)&pxVar15->flags + 1);
              *pbVar14 = *pbVar14 | 0x40;
              uVar11 = xmlStreamCompAddStep
                                 (pxVar15,(xmlChar *)0x0,(xmlChar *)0x0,100,flags_00 | 0x10);
              if (-1 < (int)uVar11) {
                if (uVar12 != 0xffffffff) {
                  pxVar15->steps[uVar12].flags = pxVar15->steps[uVar12].flags | 0x20;
                }
                goto LAB_0016abe8;
              }
              goto LAB_0016ac4a;
            }
            break;
          case 3:
switchD_0016ab2f_caseD_3:
            goto LAB_0016abb7;
          case 4:
            uVar11 = xmlStreamCompAddStep(pxVar15,pxVar22,pxVar19,2,flags_00 | 8);
            if ((int)uVar11 < 0) goto LAB_0016ac4a;
LAB_0016abe8:
            flags_00 = 0;
            uVar12 = 0xffffffff;
            break;
          case 6:
            if (flags_00 == 0) {
              if (((uint)pxVar15->flags >> 0x10 & 1) == 0) {
                pxVar15->flags = pxVar15->flags | 0x10000;
              }
              flags_00 = 1;
            }
            break;
          case 7:
            pxVar19 = pxVar22;
            pxVar22 = (xmlChar *)0x0;
            goto LAB_0016abb7;
          case 8:
            pxVar19 = (xmlChar *)0x0;
            pxVar22 = (xmlChar *)0x0;
LAB_0016abb7:
            uVar11 = xmlStreamCompAddStep(pxVar15,pxVar22,pxVar19,1,flags_00);
            if ((int)uVar11 < 0) goto LAB_0016ac4a;
            flags_00 = 0;
            uVar12 = uVar11;
          }
switchD_0016ab2f_caseD_5:
          lVar21 = lVar21 + 0x18;
        }
        if ((!bVar8) && ((comp->flags & 7) == 0)) {
          if (((uint)pxVar15->flags >> 0x10 & 1) == 0) {
            pxVar15->flags = pxVar15->flags | 0x10000;
          }
          if (0 < pxVar15->nbStep) {
            uVar12 = pxVar15->steps->flags;
            if ((uVar12 & 1) == 0) {
              pxVar15->steps->flags = uVar12 | 1;
            }
          }
        }
        if ((int)uVar11 < pxVar15->nbStep) {
          pxVar5 = pxVar15->steps;
          pxVar5[uVar11].flags = pxVar5[uVar11].flags | 2;
          if (bVar8) {
            *(byte *)&pxVar5->flags = (byte)pxVar5->flags | 4;
          }
          comp->stream = pxVar15;
        }
        else {
LAB_0016ac4a:
          xmlFreeStreamComp(pxVar15);
        }
        goto LAB_0016ac5e;
      }
    }
  }
LAB_0016b19d:
  iVar13 = -1;
LAB_0016b1e6:
  if (local_70 != (xmlPatternPtr)0x0) {
    xmlFreePatternList(local_70);
  }
  if (local_80 != (xmlChar *)0x0) {
    (*xmlFree)(local_80);
  }
  goto LAB_0016b206;
}

Assistant:

int
xmlPatternCompileSafe(const xmlChar *pattern, xmlDict *dict, int flags,
                      const xmlChar **namespaces, xmlPatternPtr *patternOut) {
    xmlPatternPtr ret = NULL, cur;
    xmlPatParserContextPtr ctxt = NULL;
    const xmlChar *or, *start;
    xmlChar *tmp = NULL;
    int type = 0;
    int streamable = 1;
    int error;

    if (patternOut == NULL)
        return(1);

    if (pattern == NULL) {
        error = 1;
        goto error;
    }

    start = pattern;
    or = start;
    while (*or != 0) {
	tmp = NULL;
	while ((*or != 0) && (*or != '|')) or++;
        if (*or == 0)
	    ctxt = xmlNewPatParserContext(start, dict, namespaces);
	else {
	    tmp = xmlStrndup(start, or - start);
	    if (tmp != NULL) {
		ctxt = xmlNewPatParserContext(tmp, dict, namespaces);
	    }
	    or++;
	}
	if (ctxt == NULL) {
            error = -1;
            goto error;
        }
	cur = xmlNewPattern();
	if (cur == NULL) {
            error = -1;
            goto error;
        }
	/*
	* Assign string dict.
	*/
	if (dict) {
	    cur->dict = dict;
	    xmlDictReference(dict);
	}
	if (ret == NULL)
	    ret = cur;
	else {
	    cur->next = ret->next;
	    ret->next = cur;
	}
	cur->flags = flags;
	ctxt->comp = cur;

	if (XML_STREAM_XS_IDC(cur))
	    xmlCompileIDCXPathPath(ctxt);
	else
	    xmlCompilePathPattern(ctxt);
	if (ctxt->error != 0) {
            error = ctxt->error;
	    goto error;
        }
	xmlFreePatParserContext(ctxt);
	ctxt = NULL;


        if (streamable) {
	    if (type == 0) {
	        type = cur->flags & (PAT_FROM_ROOT | PAT_FROM_CUR);
	    } else if (type == PAT_FROM_ROOT) {
	        if (cur->flags & PAT_FROM_CUR)
		    streamable = 0;
	    } else if (type == PAT_FROM_CUR) {
	        if (cur->flags & PAT_FROM_ROOT)
		    streamable = 0;
	    }
	}
	if (streamable) {
	    error = xmlStreamCompile(cur);
            if (error != 0)
                goto error;
        }
	error = xmlReversePattern(cur);
        if (error != 0)
	    goto error;
	if (tmp != NULL) {
	    xmlFree(tmp);
	    tmp = NULL;
	}
	start = or;
    }
    if (streamable == 0) {
        cur = ret;
	while (cur != NULL) {
	    if (cur->stream != NULL) {
		xmlFreeStreamComp(cur->stream);
		cur->stream = NULL;
	    }
	    cur = cur->next;
	}
    }

    *patternOut = ret;
    return(0);
error:
    if (ctxt != NULL) xmlFreePatParserContext(ctxt);
    if (ret != NULL) xmlFreePattern(ret);
    if (tmp != NULL) xmlFree(tmp);
    *patternOut = NULL;
    return(error);
}